

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exrmetrics.cpp
# Opt level: O0

void readDeepScanLine(DeepScanLineInputPart *in,DeepFrameBuffer *buf,
                     vector<double,_std::allocator<double>_> *samplePerf,
                     vector<double,_std::allocator<double>_> *countPerf)

{
  time_point start;
  vector<double,_std::allocator<double>_> *in_RCX;
  time_point in_RDX;
  DeepFrameBuffer *in_RDI;
  time_point endSampleRead;
  time_point startSampleRead;
  time_point endCountRead;
  time_point startCountRead;
  Box2i dw;
  Box<Imath_3_2::Vec2<int>_> *in_stack_ffffffffffffff68;
  Box<Imath_3_2::Vec2<int>_> *in_stack_ffffffffffffff70;
  time_point in_stack_ffffffffffffff78;
  time_point in_stack_ffffffffffffff80;
  undefined4 local_2c;
  
  Imf_3_4::DeepScanLineInputPart::setFrameBuffer(in_RDI);
  Imf_3_4::DeepScanLineInputPart::header();
  Imf_3_4::Header::dataWindow();
  Imath_3_2::Box<Imath_3_2::Vec2<int>_>::Box(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  std::chrono::_V2::steady_clock::now();
  Imf_3_4::DeepScanLineInputPart::readPixelSampleCounts((int)in_RDI,local_2c);
  std::chrono::_V2::steady_clock::now();
  timing(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  std::vector<double,_std::allocator<double>_>::push_back
            (in_RCX,(value_type_conflict1 *)in_stack_ffffffffffffff68);
  std::chrono::_V2::steady_clock::now();
  Imf_3_4::DeepScanLineInputPart::readPixels((int)in_RDI,local_2c);
  start.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
  timing(start,in_RDX);
  std::vector<double,_std::allocator<double>_>::push_back
            (in_RCX,(value_type_conflict1 *)in_stack_ffffffffffffff68);
  return;
}

Assistant:

void
readDeepScanLine (
    DeepScanLineInputPart& in,
    DeepFrameBuffer&       buf,
    vector<double>&        samplePerf,
    vector<double>&        countPerf)
{

    in.setFrameBuffer (buf);
    Box2i dw = in.header ().dataWindow ();

    steady_clock::time_point startCountRead = steady_clock::now ();
    in.readPixelSampleCounts (dw.min.y, dw.max.y);
    steady_clock::time_point endCountRead = steady_clock::now ();
    countPerf.push_back (timing (startCountRead, endCountRead));

    steady_clock::time_point startSampleRead = steady_clock::now ();
    in.readPixels (dw.min.y, dw.max.y);
    steady_clock::time_point endSampleRead = steady_clock::now ();
    samplePerf.push_back (timing (startSampleRead, endSampleRead));
}